

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayIndexStaticEnumerator.h
# Opt level: O1

bool __thiscall
Js::ES5ArrayIndexStaticEnumerator<true>::MoveNext
          (ES5ArrayIndexStaticEnumerator<true> *this,PropertyAttributes *attributes)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  uint uVar8;
  uint uVar9;
  PropertyAttributes PVar10;
  
  uVar8 = this->m_descriptorIndex;
  if (this->m_dataIndex < this->m_descriptorIndex) {
    uVar8 = this->m_dataIndex;
  }
  if (this->m_index != uVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ES5ArrayIndexStaticEnumerator.h"
                                ,0x3e,"(m_index == min(m_dataIndex, m_descriptorIndex))",
                                "m_index == min(m_dataIndex, m_descriptorIndex)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  if (this->m_index == this->m_dataIndex) {
    uVar5 = JavascriptArray::GetNextIndex(&this->m_array->super_JavascriptArray,this->m_dataIndex);
    this->m_dataIndex = uVar5;
  }
  if (this->m_index != this->m_descriptorIndex) {
    BVar6 = ES5Array::IsValidDescriptorToken(this->m_array,this->m_descriptorValidationToken);
    if (BVar6 != 0) goto LAB_00bb314b;
  }
  uVar5 = ES5Array::GetNextDescriptor
                    (this->m_array,this->m_index,&this->m_descriptor,
                     &this->m_descriptorValidationToken);
  this->m_descriptorIndex = uVar5;
LAB_00bb314b:
  uVar8 = this->m_initialLength;
  uVar1 = this->m_dataIndex;
  uVar2 = this->m_descriptorIndex;
  uVar9 = uVar2;
  if (uVar1 < uVar2) {
    uVar9 = uVar1;
  }
  this->m_index = uVar9;
  if (attributes != (PropertyAttributes *)0x0 && uVar9 < uVar8) {
    PVar10 = '\x01';
    if (uVar2 <= uVar1) {
      PVar10 = this->m_descriptor->Attributes;
    }
    *attributes = PVar10;
  }
  return uVar9 < uVar8;
}

Assistant:

bool MoveNext(PropertyAttributes* attributes = nullptr)
        {
            while (true)
            {
                Assert(m_index == min(m_dataIndex, m_descriptorIndex));
                if (m_index == m_dataIndex)
                {
                    m_dataIndex = m_array->GetNextIndex(m_dataIndex);
                }
                if (m_index == m_descriptorIndex || !m_array->IsValidDescriptorToken(m_descriptorValidationToken))
                {
                    m_descriptorIndex = m_array->GetNextDescriptor(m_index, &m_descriptor, &m_descriptorValidationToken);
                }

                m_index = min(m_dataIndex, m_descriptorIndex);
                if (m_index >= m_initialLength) // End of array
                {
                    break;
                }

                if (enumNonEnumerable
                    || m_index < m_descriptorIndex
                    || (m_descriptor->Attributes & PropertyEnumerable))
                {
                    if (attributes != nullptr)
                    {
                        if (m_index < m_descriptorIndex)
                        {
                            *attributes = PropertyEnumerable;
                        }
                        else
                        {
                            *attributes = m_descriptor->Attributes;
                        }
                    }

                    return true;
                }
            }

            return false;
        }